

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O0

REF_STATUS ref_phys_sa_surrogate(REF_DBL wall_distance,REF_DBL *nu_tilde)

{
  double dVar1;
  undefined8 local_48;
  REF_DBL height;
  REF_DBL x;
  REF_DBL boundary_layer_height;
  REF_DBL freestream_nu_tilde;
  REF_DBL max_nu_tilde;
  REF_DBL *nu_tilde_local;
  REF_DBL wall_distance_local;
  
  *nu_tilde = 0.0;
  if (0.0 < wall_distance) {
    dVar1 = wall_distance / 0.1;
    *nu_tilde = (-dVar1 * dVar1 + dVar1) * 4.0 * 1000.0;
    if (0.5 < dVar1) {
      if (*nu_tilde <= 3.0) {
        local_48 = 3.0;
      }
      else {
        local_48 = *nu_tilde;
      }
      *nu_tilde = local_48;
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_phys_sa_surrogate(REF_DBL wall_distance,
                                         REF_DBL *nu_tilde) {
  REF_DBL max_nu_tilde = 1000;
  REF_DBL freestream_nu_tilde = 3;
  REF_DBL boundary_layer_height = 0.1;
  REF_DBL x, height;

  *nu_tilde = 0.0;
  if (wall_distance > 0.0) {
    height = wall_distance / boundary_layer_height;
    x = 4.0 * (height - height * height);
    *nu_tilde = max_nu_tilde * x;
    if (height > 0.5) *nu_tilde = MAX(*nu_tilde, freestream_nu_tilde);
  }
  return REF_SUCCESS;
}